

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlTextConcat(xmlNodePtr node,xmlChar *content,int len)

{
  xmlDictPtr dict;
  int iVar1;
  xmlChar *pxVar2;
  
  if (node == (xmlNodePtr)0x0) {
    return -1;
  }
  if (XML_COMMENT_NODE < node->type) {
    return -1;
  }
  if ((0x198U >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    return -1;
  }
  pxVar2 = node->content;
  if ((_xmlAttr **)pxVar2 == &node->properties) {
LAB_00183177:
    pxVar2 = xmlStrncatNew(pxVar2,content,len);
  }
  else {
    if ((node->doc != (_xmlDoc *)0x0) && (dict = node->doc->dict, dict != (xmlDictPtr)0x0)) {
      iVar1 = xmlDictOwns(dict,pxVar2);
      pxVar2 = node->content;
      if (iVar1 != 0) goto LAB_00183177;
    }
    pxVar2 = xmlStrncat(pxVar2,content,len);
  }
  node->content = pxVar2;
  node->properties = (_xmlAttr *)0x0;
  return -(uint)(pxVar2 == (xmlChar *)0x0);
}

Assistant:

int
xmlTextConcat(xmlNodePtr node, const xmlChar *content, int len) {
    if (node == NULL) return(-1);

    if ((node->type != XML_TEXT_NODE) &&
        (node->type != XML_CDATA_SECTION_NODE) &&
	(node->type != XML_COMMENT_NODE) &&
	(node->type != XML_PI_NODE)) {
#ifdef DEBUG_TREE
	xmlGenericError(xmlGenericErrorContext,
		"xmlTextConcat: node is not text nor CDATA\n");
#endif
        return(-1);
    }
    /* need to check if content is currently in the dictionary */
    if ((node->content == (xmlChar *) &(node->properties)) ||
        ((node->doc != NULL) && (node->doc->dict != NULL) &&
		xmlDictOwns(node->doc->dict, node->content))) {
	node->content = xmlStrncatNew(node->content, content, len);
    } else {
        node->content = xmlStrncat(node->content, content, len);
    }
    node->properties = NULL;
    if (node->content == NULL)
        return(-1);
    return(0);
}